

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O3

void __thiscall
soplex::SPxMainSM<double>::FreeColSingletonPS::execute
          (FreeColSingletonPS *this,VectorBase<double> *x,VectorBase<double> *y,
          VectorBase<double> *s,VectorBase<double> *r,
          DataArray<soplex::SPxSolverBase<double>::VarStatus> *cStatus,
          DataArray<soplex::SPxSolverBase<double>::VarStatus> *rStatus,bool isOptimal)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  pointer pdVar4;
  Nonzero<double> *pNVar5;
  undefined1 auVar6 [16];
  long lVar7;
  double dVar8;
  double extraout_XMM0_Qa;
  double dVar9;
  undefined1 auVar10 [16];
  double local_68;
  
  iVar1 = this->m_i;
  iVar2 = this->m_old_i;
  if (iVar1 != iVar2) {
    pdVar4 = (s->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4[iVar2] = pdVar4[iVar1];
    pdVar4 = (y->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4[iVar2] = pdVar4[iVar1];
    rStatus->data[iVar2] = rStatus->data[iVar1];
  }
  iVar1 = this->m_j;
  iVar2 = this->m_old_j;
  if (iVar1 != iVar2) {
    pdVar4 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4[iVar2] = pdVar4[iVar1];
    pdVar4 = (r->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4[iVar2] = pdVar4[iVar1];
    cStatus->data[iVar2] = cStatus->data[iVar1];
  }
  pNVar5 = (this->m_row).super_SVectorBase<double>.m_elem;
  uVar3 = (this->m_row).super_SVectorBase<double>.memused;
  dVar8 = 0.0;
  local_68 = 0.0;
  if (pNVar5 != (Nonzero<double> *)0x0) {
    if ((int)uVar3 < 1) {
      local_68 = 0.0;
      goto LAB_00221bde;
    }
    lVar7 = 0;
    do {
      if (*(int *)((long)&pNVar5->idx + lVar7) == iVar1) {
        local_68 = *(double *)((long)&pNVar5->val + lVar7);
        goto LAB_00221ba4;
      }
      lVar7 = lVar7 + 0x10;
    } while ((ulong)uVar3 << 4 != lVar7);
    local_68 = 0.0;
  }
LAB_00221ba4:
  if (0 < (int)uVar3) {
    dVar8 = 0.0;
    lVar7 = 0;
    do {
      iVar2 = *(int *)((long)&pNVar5->idx + lVar7);
      if (iVar2 != iVar1) {
        dVar8 = dVar8 + *(double *)((long)&pNVar5->val + lVar7) *
                        (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[iVar2];
      }
      lVar7 = lVar7 + 0x10;
    } while ((ulong)uVar3 << 4 != lVar7);
  }
LAB_00221bde:
  dVar9 = ABS(this->m_lRhs);
  auVar10._8_8_ = dVar8;
  auVar10._0_8_ = this->m_lRhs;
  if (dVar9 <= ABS(dVar8)) {
    dVar9 = ABS(dVar8);
  }
  dVar8 = 1.0;
  if (1.0 <= dVar9) {
    dVar8 = dVar9;
  }
  auVar6._8_8_ = dVar8;
  auVar6._0_8_ = dVar8;
  auVar10 = divpd(auVar10,auVar6);
  dVar9 = auVar10._0_8_ - auVar10._8_8_;
  (*(this->super_PostStep)._vptr_PostStep[7])(this);
  iVar1 = this->m_j;
  (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start[iVar1] =
       ((double)(~-(ulong)(ABS(dVar9) <= extraout_XMM0_Qa) & (ulong)dVar9) * dVar8) / local_68;
  iVar2 = this->m_i;
  (s->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start[iVar2] = this->m_lRhs;
  (y->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start[iVar2] = this->m_obj / local_68;
  (r->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start[iVar1] = 0.0;
  cStatus->data[iVar1] = BASIC;
  if (this->m_eqCons == false) {
    if (this->m_onLhs == true) {
      rStatus->data[iVar2] = ON_LOWER;
    }
    else {
      rStatus->data[iVar2] = ON_UPPER;
    }
  }
  else {
    rStatus->data[iVar2] = FIXED;
  }
  return;
}

Assistant:

void SPxMainSM<R>::FreeColSingletonPS::execute(VectorBase<R>& x, VectorBase<R>& y, VectorBase<R>& s,
      VectorBase<R>& r,
      DataArray<typename SPxSolverBase<R>::VarStatus>& cStatus,
      DataArray<typename SPxSolverBase<R>::VarStatus>& rStatus, bool isOptimal) const
{

   // correcting the change of idx by deletion of the row:
   if(m_i != m_old_i)
   {
      s[m_old_i] = s[m_i];
      y[m_old_i] = y[m_i];
      rStatus[m_old_i] = rStatus[m_i];
   }

   // correcting the change of idx by deletion of the column:
   if(m_j != m_old_j)
   {
      x[m_old_j] = x[m_j];
      r[m_old_j] = r[m_j];
      cStatus[m_old_j] = cStatus[m_j];
   }

   // primal:
   R val = 0.0;
   R aij = m_row[m_j];

   for(int k = 0; k < m_row.size(); ++k)
   {
      if(m_row.index(k) != m_j)
         val += m_row.value(k) * x[m_row.index(k)];
   }

   R scale = maxAbs(m_lRhs, val);

   if(scale < 1.0)
      scale = 1.0;

   R z = (m_lRhs / scale) - (val / scale);

   if(isZero(z, this->epsilon()))
      z = 0.0;

   x[m_j] = z * scale / aij;
   s[m_i] = m_lRhs;

   // dual:
   y[m_i] = m_obj / aij;
   r[m_j] = 0.0;

   // basis:
   cStatus[m_j] = SPxSolverBase<R>::BASIC;

   if(m_eqCons)
      rStatus[m_i] = SPxSolverBase<R>::FIXED;
   else if(m_onLhs)
      rStatus[m_i] = SPxSolverBase<R>::ON_LOWER;
   else
      rStatus[m_i] = SPxSolverBase<R>::ON_UPPER;

#ifdef SOPLEX_CHECK_BASIS_DIM

   if(!this->checkBasisDim(rStatus, cStatus))
   {
      throw SPxInternalCodeException("XMAISM22 Dimension doesn't match after this step.");
   }

#endif
}